

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

token * __thiscall
mjs::parser::expect(token *__return_storage_ptr__,parser *this,token_type tt,char *func,int line)

{
  bool bVar1;
  ostream *poVar2;
  token *t_00;
  runtime_error *this_00;
  string local_1d8 [48];
  ostringstream local_1a8 [8];
  ostringstream oss;
  int line_local;
  char *func_local;
  token_type tt_local;
  parser *this_local;
  token *t;
  
  accept((parser *)__return_storage_ptr__,(int)this,(sockaddr *)(ulong)tt,(socklen_t *)func);
  bVar1 = token::operator_cast_to_bool(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"Expected ");
  poVar2 = mjs::operator<<(poVar2,tt);
  poVar2 = std::operator<<(poVar2," in ");
  poVar2 = std::operator<<(poVar2,func);
  poVar2 = std::operator<<(poVar2," line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
  poVar2 = std::operator<<(poVar2," got ");
  t_00 = current_token(this);
  mjs::operator<<(poVar2,t_00);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

token expect(token_type tt, const char* func, int line) {
        auto t = accept(tt);
        if (!t) {
            std::ostringstream oss;
            oss << "Expected " << tt << " in " << func << " line " << line << " got " << current_token();
            throw std::runtime_error(oss.str());
        }
        return t;
    }